

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

JsonNode * jsonLookup(JsonParse *pParse,char *zPath,int *pApnd,sqlite3_context *pCtx)

{
  JsonNode *pJVar1;
  JsonNode *pJVar2;
  char *z;
  char *zMsg;
  JsonNode *pNode;
  char *zErr;
  sqlite3_context *pCtx_local;
  int *pApnd_local;
  char *zPath_local;
  JsonParse *pParse_local;
  
  pNode = (JsonNode *)0x0;
  if (zPath != (char *)0x0) {
    pJVar1 = (JsonNode *)zPath;
    zErr = (char *)pCtx;
    pCtx_local = (sqlite3_context *)pApnd;
    pApnd_local = (int *)zPath;
    zPath_local = (char *)pParse;
    if (*zPath == '$') {
      pApnd_local = (int *)(zPath + 1);
      pJVar2 = jsonLookupStep(pParse,0,(char *)pApnd_local,pApnd,(char **)&pNode);
      pJVar1 = pNode;
      if (pNode == (JsonNode *)0x0) {
        return pJVar2;
      }
    }
    pNode = pJVar1;
    zPath_local[0x21] = zPath_local[0x21] + '\x01';
    z = jsonPathSyntaxError((char *)pNode);
    if (z == (char *)0x0) {
      sqlite3_result_error_nomem((sqlite3_context *)zErr);
    }
    else {
      sqlite3_result_error((sqlite3_context *)zErr,z,-1);
      sqlite3_free(z);
    }
  }
  return (JsonNode *)0x0;
}

Assistant:

static JsonNode *jsonLookup(
  JsonParse *pParse,      /* The JSON to search */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  sqlite3_context *pCtx   /* Report errors here, if not NULL */
){
  const char *zErr = 0;
  JsonNode *pNode = 0;
  char *zMsg;

  if( zPath==0 ) return 0;
  if( zPath[0]!='$' ){
    zErr = zPath;
    goto lookup_err;
  }
  zPath++;
  pNode = jsonLookupStep(pParse, 0, zPath, pApnd, &zErr);
  if( zErr==0 ) return pNode;

lookup_err:
  pParse->nErr++;
  assert( zErr!=0 && pCtx!=0 );
  zMsg = jsonPathSyntaxError(zErr);
  if( zMsg ){
    sqlite3_result_error(pCtx, zMsg, -1);
    sqlite3_free(zMsg);
  }else{
    sqlite3_result_error_nomem(pCtx);
  }
  return 0;
}